

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>::alloc
          (array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>
           *this,int new_len)

{
  CRuleCondition *pCVar1;
  undefined1 auVar2 [16];
  CRuleCondition *pCVar3;
  long lVar4;
  ulong uVar5;
  
  this->list_size = new_len;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)new_len;
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0xc),8) == 0) {
    uVar5 = SUB168(auVar2 * ZEXT816(0xc),0);
  }
  pCVar3 = (CRuleCondition *)operator_new__(uVar5);
  if (this->num_elements < new_len) {
    new_len = this->num_elements;
  }
  pCVar1 = this->list;
  if (new_len < 1) {
    if (pCVar1 == (CRuleCondition *)0x0) goto LAB_00190c4f;
  }
  else {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)&pCVar3->m_Value + lVar4) =
           *(undefined4 *)((long)&pCVar1->m_Value + lVar4);
      *(undefined8 *)((long)&pCVar3->m_X + lVar4) = *(undefined8 *)((long)&pCVar1->m_X + lVar4);
      lVar4 = lVar4 + 0xc;
    } while ((ulong)(uint)new_len * 0xc != lVar4);
  }
  operator_delete__(pCVar1);
  new_len = this->list_size;
  if (this->num_elements < this->list_size) {
    new_len = this->num_elements;
  }
LAB_00190c4f:
  this->num_elements = new_len;
  this->list = pCVar3;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}